

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

int __thiscall GameBoard::transfer(GameBoard *this)

{
  int iVar1;
  long in_RDI;
  int j_1;
  int i_1;
  int h2_1;
  int h1;
  int j;
  int i;
  int h2;
  int color2;
  int color1;
  int local_34;
  int local_30;
  int local_24;
  int local_20;
  int local_18;
  int local_14 [4];
  int local_4;
  
  local_14[0] = 0;
  local_18 = 1;
  if ((*(int *)(in_RDI + 0x9d4) == 0) && (*(int *)(in_RDI + 0x9d8) == 0)) {
    local_4 = -1;
  }
  else if ((*(int *)(in_RDI + 0x9d4) == 0) || (*(int *)(in_RDI + 0x9d8) == 0)) {
    if ((*(int *)(in_RDI + 0x9d4) == 0) && (0 < *(int *)(in_RDI + 0x9d8))) {
      std::swap<int>(local_14,&local_18);
    }
    local_20 = *(int *)(in_RDI + 0x9dc + (long)local_18 * 4) +
               *(int *)(in_RDI + 0x9d4 + (long)local_14[0] * 4);
    *(int *)(in_RDI + 0x9dc + (long)local_18 * 4) = local_20;
    if (local_20 < 0x15) {
      for (; *(int *)(in_RDI + 0x9d4 + (long)local_14[0] * 4) < local_20; local_20 = local_20 + -1)
      {
        for (local_24 = 1; local_24 < 0xb; local_24 = local_24 + 1) {
          *(undefined4 *)
           (in_RDI + 0x14 + (long)local_18 * 0x420 + (long)local_20 * 0x30 + (long)local_24 * 4) =
               *(undefined4 *)
                (in_RDI + 0x14 + (long)local_18 * 0x420 +
                 (long)(local_20 - *(int *)(in_RDI + 0x9d4 + (long)local_14[0] * 4)) * 0x30 +
                (long)local_24 * 4);
        }
      }
      for (local_20 = *(int *)(in_RDI + 0x9d4 + (long)local_14[0] * 4); 0 < local_20;
          local_20 = local_20 + -1) {
        for (local_24 = 1; local_24 < 0xb; local_24 = local_24 + 1) {
          *(undefined4 *)
           (in_RDI + 0x14 + (long)local_18 * 0x420 + (long)local_20 * 0x30 + (long)local_24 * 4) =
               *(undefined4 *)
                (in_RDI + 0x854 + (long)local_14[0] * 0xc0 + (long)(local_20 + -1) * 0x30 +
                (long)local_24 * 4);
        }
      }
      local_4 = -1;
    }
    else {
      local_4 = local_18;
    }
  }
  else {
    iVar1 = *(int *)(in_RDI + 0x9dc) + *(int *)(in_RDI + 0x9d8);
    *(int *)(in_RDI + 0x9dc) = iVar1;
    local_30 = *(int *)(in_RDI + 0x9e0) + *(int *)(in_RDI + 0x9d4);
    *(int *)(in_RDI + 0x9e0) = local_30;
    if (iVar1 < 0x15) {
      if (local_30 < 0x15) {
        for (; *(int *)(in_RDI + 0x9d4) < local_30; local_30 = local_30 + -1) {
          for (local_34 = 1; local_34 < 0xb; local_34 = local_34 + 1) {
            *(undefined4 *)(in_RDI + 0x434 + (long)local_30 * 0x30 + (long)local_34 * 4) =
                 *(undefined4 *)
                  (in_RDI + 0x434 + (long)(local_30 - *(int *)(in_RDI + 0x9d4)) * 0x30 +
                  (long)local_34 * 4);
          }
        }
        for (local_30 = *(int *)(in_RDI + 0x9d4); 0 < local_30; local_30 = local_30 + -1) {
          for (local_34 = 1; local_34 < 0xb; local_34 = local_34 + 1) {
            *(undefined4 *)(in_RDI + 0x434 + (long)local_30 * 0x30 + (long)local_34 * 4) =
                 *(undefined4 *)(in_RDI + 0x854 + (long)(local_30 + -1) * 0x30 + (long)local_34 * 4)
            ;
          }
        }
        while (local_30 = iVar1, *(int *)(in_RDI + 0x9d8) < local_30) {
          for (local_34 = 1; local_34 < 0xb; local_34 = local_34 + 1) {
            *(undefined4 *)(in_RDI + 0x14 + (long)local_30 * 0x30 + (long)local_34 * 4) =
                 *(undefined4 *)
                  (in_RDI + 0x14 + (long)(local_30 - *(int *)(in_RDI + 0x9d8)) * 0x30 +
                  (long)local_34 * 4);
          }
          iVar1 = local_30 + -1;
        }
        for (local_30 = *(int *)(in_RDI + 0x9d8); 0 < local_30; local_30 = local_30 + -1) {
          for (local_34 = 1; local_34 < 0xb; local_34 = local_34 + 1) {
            *(undefined4 *)(in_RDI + 0x14 + (long)local_30 * 0x30 + (long)local_34 * 4) =
                 *(undefined4 *)(in_RDI + 0x914 + (long)(local_30 + -1) * 0x30 + (long)local_34 * 4)
            ;
          }
        }
        local_4 = -1;
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int GameBoard::transfer()
{
    int color1 = 0, color2 = 1;
    if (transCount[color1] == 0 && transCount[color2] == 0)
        return -1;
    if (transCount[color1] == 0 || transCount[color2] == 0) {
        if (transCount[color1] == 0 && transCount[color2] > 0)
            swap(color1, color2);
        int h2;
        maxHeight[color2] = h2 = maxHeight[color2] + transCount[color1];
        if (h2 > MAPHEIGHT)
            return color2;
        int i, j;

        for (i = h2; i > transCount[color1]; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color2][i][j] = gridInfo[color2][i - transCount[color1]][j];

        for (i = transCount[color1]; i > 0; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color2][i][j] = trans[color1][i - 1][j];
        return -1;
    }
    else {
        int h1, h2;
        maxHeight[color1] = h1 = maxHeight[color1] + transCount[color2];//从color1处移动count1去color2
        maxHeight[color2] = h2 = maxHeight[color2] + transCount[color1];

        if (h1 > MAPHEIGHT)
            return color1;
        if (h2 > MAPHEIGHT)
            return color2;

        int i, j;
        for (i = h2; i > transCount[color1]; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color2][i][j] = gridInfo[color2][i - transCount[color1]][j];

        for (i = transCount[color1]; i > 0; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color2][i][j] = trans[color1][i - 1][j];

        for (i = h1; i > transCount[color2]; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color1][i][j] = gridInfo[color1][i - transCount[color2]][j];

        for (i = transCount[color2]; i > 0; i--)
            for (j = 1; j <= MAPWIDTH; j++)
                gridInfo[color1][i][j] = trans[color2][i - 1][j];

        return -1;
    }
}